

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O1

ProgramData *
deqp::gles3::Performance::anon_unknown_1::defaultProgramData
          (ProgramData *__return_storage_ptr__,CaseShaderType shaderType,string *funcDefs,
          string *mainStatements)

{
  pointer pcVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  string fragPrec;
  string vtxPrec;
  allocator_type local_571;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  long *local_550 [2];
  long local_540 [2];
  long *local_530;
  long local_528;
  long local_520;
  long lStack_518;
  long *local_510;
  long local_508;
  long local_500;
  long lStack_4f8;
  long *local_4f0;
  long local_4e8;
  long local_4e0;
  long lStack_4d8;
  long *local_4d0;
  long local_4c8;
  long local_4c0;
  undefined4 uStack_4b8;
  undefined4 uStack_4b4;
  long *local_4b0 [2];
  long local_4a0 [2];
  long *local_490;
  long local_488;
  long local_480;
  long lStack_478;
  long *local_470;
  long local_468;
  long local_460;
  long lStack_458;
  long *local_450;
  long local_448;
  long local_440;
  long lStack_438;
  long *local_430;
  long local_428;
  long local_420;
  undefined4 uStack_418;
  undefined4 uStack_414;
  long *local_410;
  long local_408;
  long local_400;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  long *local_3d0 [2];
  long local_3c0 [2];
  long *local_3b0;
  long local_3a8;
  long local_3a0;
  undefined4 uStack_398;
  undefined4 uStack_394;
  long *local_390;
  long local_388;
  long local_380;
  long lStack_378;
  long *local_370;
  long local_368;
  long local_360;
  long lStack_358;
  long *local_350;
  long local_348;
  long local_340;
  undefined4 uStack_338;
  undefined4 uStack_334;
  long *local_330;
  long local_328;
  long local_320;
  long lStack_318;
  long *local_310;
  long local_308;
  long local_300;
  long lStack_2f8;
  long *local_2f0;
  long local_2e8;
  long local_2e0;
  long lStack_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0;
  long lStack_2b8;
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290 [2];
  long local_280 [2];
  long *local_270;
  long local_268;
  long local_260;
  undefined4 uStack_258;
  undefined4 uStack_254;
  long *local_250;
  long local_248;
  long local_240;
  long lStack_238;
  uint local_230;
  value_type local_228;
  uint local_208;
  value_type local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  AttribSpec local_1a0;
  Vec4 local_140;
  Vec4 local_130;
  Vec4 local_120;
  Vec4 local_110;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_100 [6];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  deUint32 local_58;
  undefined1 local_50 [24];
  bool bStack_38;
  
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0.field_2._M_allocated_capacity._0_4_ = 0x68676968;
  local_3f0.field_2._M_allocated_capacity._4_2_ = 0x70;
  local_3f0._M_string_length = 5;
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  local_570.field_2._M_allocated_capacity._0_4_ = 0x68676968;
  local_570.field_2._M_allocated_capacity._4_2_ = 0x70;
  local_570._M_string_length = 5;
  local_50[0x10] = 0;
  stack0xffffffffffffffc1 = 0;
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  memset(local_100,0,0xac);
  std::operator+(&local_1c0,"#version 300 es\nin ",&local_3f0);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  local_330 = &local_320;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_320 = *plVar3;
    lStack_318 = plVar2[3];
  }
  else {
    local_320 = *plVar3;
    local_330 = (long *)*plVar2;
  }
  local_328 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_330,(ulong)local_3f0._M_dataplus._M_p);
  local_310 = &local_300;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_300 = *plVar3;
    lStack_2f8 = plVar2[3];
  }
  else {
    local_300 = *plVar3;
    local_310 = (long *)*plVar2;
  }
  local_308 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_310);
  local_2f0 = &local_2e0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_2e0 = *plVar3;
    lStack_2d8 = plVar2[3];
  }
  else {
    local_2e0 = *plVar3;
    local_2f0 = (long *)*plVar2;
  }
  local_2e8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_2f0,(ulong)local_570._M_dataplus._M_p);
  local_2d0 = &local_2c0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_2c0 = *plVar3;
    lStack_2b8 = plVar2[3];
  }
  else {
    local_2c0 = *plVar3;
    local_2d0 = (long *)*plVar2;
  }
  local_2c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_2d0);
  local_3b0 = &local_3a0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_3a0 = *plVar3;
    uStack_398 = (undefined4)plVar2[3];
    uStack_394 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_3a0 = *plVar3;
    local_3b0 = (long *)*plVar2;
  }
  local_3a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_4b0[0] = local_4a0;
  if (shaderType == CASESHADERTYPE_VERTEX) {
    pcVar1 = (funcDefs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_4b0,pcVar1,pcVar1 + funcDefs->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4b0,"");
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_3b0,(ulong)local_4b0[0]);
  local_490 = &local_480;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_480 = *plVar3;
    lStack_478 = plVar2[3];
  }
  else {
    local_480 = *plVar3;
    local_490 = (long *)*plVar2;
  }
  local_488 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_490);
  local_470 = &local_460;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_460 = *plVar3;
    lStack_458 = plVar2[3];
  }
  else {
    local_460 = *plVar3;
    local_470 = (long *)*plVar2;
  }
  local_468 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_470,(ulong)local_3f0._M_dataplus._M_p);
  local_450 = &local_440;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_440 = *plVar3;
    lStack_438 = plVar2[3];
  }
  else {
    local_440 = *plVar3;
    local_450 = (long *)*plVar2;
  }
  local_448 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_450);
  local_430 = &local_420;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_420 = *plVar3;
    uStack_418 = (undefined4)plVar2[3];
    uStack_414 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_420 = *plVar3;
    local_430 = (long *)*plVar2;
  }
  local_428 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_3d0[0] = local_3c0;
  if (shaderType == CASESHADERTYPE_VERTEX) {
    pcVar1 = (mainStatements->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_3d0,pcVar1,pcVar1 + mainStatements->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3d0,"");
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_430,(ulong)local_3d0[0]);
  local_2b0 = &local_2a0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_2a0 = *plVar3;
    lStack_298 = plVar2[3];
  }
  else {
    local_2a0 = *plVar3;
    local_2b0 = (long *)*plVar2;
  }
  local_2a8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_2b0);
  local_410 = &local_400;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_400 = *plVar3;
    uStack_3f8 = (undefined4)plVar2[3];
    uStack_3f4 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_400 = *plVar3;
    local_410 = (long *)*plVar2;
  }
  local_408 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_208 = 0;
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_410,local_408 + (long)local_410);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100 + local_208,&local_200);
  std::operator+(&local_1e0,"#version 300 es\nlayout (location = 0) out ",&local_570);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1e0);
  local_390 = &local_380;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_380 = *plVar3;
    lStack_378 = plVar2[3];
  }
  else {
    local_380 = *plVar3;
    local_390 = (long *)*plVar2;
  }
  local_388 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_390,(ulong)local_570._M_dataplus._M_p);
  local_370 = &local_360;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_360 = *plVar3;
    lStack_358 = plVar2[3];
  }
  else {
    local_360 = *plVar3;
    local_370 = (long *)*plVar2;
  }
  local_368 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_370);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_260 = *plVar3;
    uStack_258 = (undefined4)plVar2[3];
    uStack_254 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_270 = &local_260;
  }
  else {
    local_260 = *plVar3;
    local_270 = (long *)*plVar2;
  }
  local_268 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_550[0] = local_540;
  if (shaderType == CASESHADERTYPE_FRAGMENT) {
    pcVar1 = (funcDefs->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_550,pcVar1,pcVar1 + funcDefs->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_550,"");
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_550[0]);
  local_530 = &local_520;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_520 = *plVar3;
    lStack_518 = plVar2[3];
  }
  else {
    local_520 = *plVar3;
    local_530 = (long *)*plVar2;
  }
  local_528 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_530);
  local_510 = &local_500;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_500 = *plVar3;
    lStack_4f8 = plVar2[3];
  }
  else {
    local_500 = *plVar3;
    local_510 = (long *)*plVar2;
  }
  local_508 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_510,(ulong)local_570._M_dataplus._M_p);
  local_4f0 = &local_4e0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_4e0 = *plVar3;
    lStack_4d8 = plVar2[3];
  }
  else {
    local_4e0 = *plVar3;
    local_4f0 = (long *)*plVar2;
  }
  local_4e8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_4f0);
  local_4d0 = &local_4c0;
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_4c0 = *plVar3;
    uStack_4b8 = (undefined4)plVar2[3];
    uStack_4b4 = *(undefined4 *)((long)plVar2 + 0x1c);
  }
  else {
    local_4c0 = *plVar3;
    local_4d0 = (long *)*plVar2;
  }
  local_4c8 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_290[0] = local_280;
  if (shaderType == CASESHADERTYPE_FRAGMENT) {
    pcVar1 = (mainStatements->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_290,pcVar1,pcVar1 + mainStatements->_M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_290,"");
  }
  plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_4d0,(ulong)local_290[0]);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_240 = *plVar3;
    lStack_238 = plVar2[3];
    local_250 = &local_240;
  }
  else {
    local_240 = *plVar3;
    local_250 = (long *)*plVar2;
  }
  local_248 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_250);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_340 = *plVar3;
    uStack_338 = (undefined4)plVar2[3];
    uStack_334 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_350 = &local_340;
  }
  else {
    local_340 = *plVar3;
    local_350 = (long *)*plVar2;
  }
  local_348 = plVar2[1];
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_230 = 1;
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,local_350,local_348 + (long)local_350);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(local_100 + local_230,&local_228);
  local_110.m_data[0] = 1.0;
  local_110.m_data[1] = 0.0;
  local_110.m_data[2] = 0.0;
  local_110.m_data[3] = 0.0;
  local_120.m_data[0] = 0.0;
  local_120.m_data[1] = 1.0;
  local_120.m_data[2] = 0.0;
  local_120.m_data[3] = 0.0;
  local_130.m_data[0] = 0.0;
  local_130.m_data[1] = 0.0;
  local_130.m_data[2] = 1.0;
  local_130.m_data[3] = 0.0;
  local_140.m_data[0] = 0.0;
  local_140.m_data[1] = 0.0;
  local_140.m_data[2] = 0.0;
  local_140.m_data[3] = 1.0;
  deqp::gls::AttribSpec::AttribSpec
            (&local_1a0,"a_value",&local_110,&local_120,&local_130,&local_140);
  lVar4 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&(__return_storage_ptr__->sources).sources[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar4),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&local_100[0].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&(__return_storage_ptr__->sources).attribLocationBindings,&local_70);
  (__return_storage_ptr__->sources).transformFeedbackBufferMode = local_58;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&(__return_storage_ptr__->sources).transformFeedbackVaryings,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_50);
  (__return_storage_ptr__->sources).separable = bStack_38;
  std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::vector
            (&__return_storage_ptr__->attributes,1,&local_1a0,&local_571);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0.name._M_dataplus._M_p != &local_1a0.name.field_2) {
    operator_delete(local_1a0.name._M_dataplus._M_p,local_1a0.name.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if (local_350 != &local_340) {
    operator_delete(local_350,local_340 + 1);
  }
  if (local_250 != &local_240) {
    operator_delete(local_250,local_240 + 1);
  }
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,local_4c0 + 1);
  }
  if (local_4f0 != &local_4e0) {
    operator_delete(local_4f0,local_4e0 + 1);
  }
  if (local_510 != &local_500) {
    operator_delete(local_510,local_500 + 1);
  }
  if (local_530 != &local_520) {
    operator_delete(local_530,local_520 + 1);
  }
  if (local_550[0] != local_540) {
    operator_delete(local_550[0],local_540[0] + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_370 != &local_360) {
    operator_delete(local_370,local_360 + 1);
  }
  if (local_390 != &local_380) {
    operator_delete(local_390,local_380 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_410 != &local_400) {
    operator_delete(local_410,local_400 + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  if (local_3d0[0] != local_3c0) {
    operator_delete(local_3d0[0],local_3c0[0] + 1);
  }
  if (local_430 != &local_420) {
    operator_delete(local_430,local_420 + 1);
  }
  if (local_450 != &local_440) {
    operator_delete(local_450,local_440 + 1);
  }
  if (local_470 != &local_460) {
    operator_delete(local_470,local_460 + 1);
  }
  if (local_490 != &local_480) {
    operator_delete(local_490,local_480 + 1);
  }
  if (local_4b0[0] != local_4a0) {
    operator_delete(local_4b0[0],local_4a0[0] + 1);
  }
  if (local_3b0 != &local_3a0) {
    operator_delete(local_3b0,local_3a0 + 1);
  }
  if (local_2d0 != &local_2c0) {
    operator_delete(local_2d0,local_2c0 + 1);
  }
  if (local_2f0 != &local_2e0) {
    operator_delete(local_2f0,local_2e0 + 1);
  }
  if (local_310 != &local_300) {
    operator_delete(local_310,local_300 + 1);
  }
  if (local_330 != &local_320) {
    operator_delete(local_330,local_320 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar4 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_100[0].
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,
                    CONCAT26(local_570.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_570.field_2._M_allocated_capacity._4_2_,
                                      local_570.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT26(local_3f0.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_3f0.field_2._M_allocated_capacity._4_2_,
                                      local_3f0.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static inline ProgramData defaultProgramData (CaseShaderType shaderType, const string& funcDefs, const string& mainStatements)
{
	const bool		isVertexCase	= shaderType == CASESHADERTYPE_VERTEX;
	const bool		isFragmentCase	= shaderType == CASESHADERTYPE_FRAGMENT;
	const string	vtxPrec			= getShaderPrecision(CASESHADERTYPE_VERTEX);
	const string	fragPrec		= getShaderPrecision(CASESHADERTYPE_FRAGMENT);

	return ProgramData(glu::ProgramSources() << glu::VertexSource(		"#version 300 es\n"
																		"in " + vtxPrec + " vec4 a_position;\n"
																		"in " + vtxPrec + " vec4 a_value;\n"
																		"out " + fragPrec + " vec4 v_value;\n"
																		+ (isVertexCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	gl_Position = a_position;\n"
																		"	" + vtxPrec + " vec4 value = a_value;\n"
																		+ (isVertexCase ? mainStatements : "") +
																		"	v_value = value;\n"
																		"}\n")

											 << glu::FragmentSource(	"#version 300 es\n"
																		"layout (location = 0) out " + fragPrec + " vec4 o_color;\n"
																		"in " + fragPrec + " vec4 v_value;\n"
																		+ (isFragmentCase ? funcDefs : "") +
																		"void main (void)\n"
																		"{\n"
																		"	" + fragPrec + " vec4 value = v_value;\n"
																		+ (isFragmentCase ? mainStatements : "") +
																		"	o_color = value;\n"
																		"}\n"),
					  gls::AttribSpec("a_value",
									  Vec4(1.0f, 0.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 1.0f, 0.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 1.0f, 0.0f),
									  Vec4(0.0f, 0.0f, 0.0f, 1.0f)));
}